

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)0x1770d6a);
  vVar2 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
          ::val((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                 *)0x1770d7d);
  return vVar1 * vVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}